

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Token * __thiscall llvm::yaml::Scanner::peekNext(Scanner *this)

{
  list_type *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  long *plVar3;
  bool bVar4;
  iterator I;
  Node *pNVar5;
  ilist_node_base<false> *piVar6;
  byte bVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  Token local_68;
  
  this_00 = &(this->TokenQueue).List;
  bVar7 = 0;
  do {
    piVar6 = (this_00->Sentinel).
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Prev;
    if (!(bool)(~bVar7 & piVar6 != (ilist_node_base<false> *)this_00)) {
      bVar4 = fetchMoreTokens(this);
      if (!bVar4) {
        for (I.NodePtr = (node_pointer)
                         (this->TokenQueue).List.Sentinel.
                         super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                         .super_node_base_type.Next; (list_type *)I.NodePtr != this_00;
            I = simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
                ::
                eraseAndDispose<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Disposer>
                          ((simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
                            *)this_00,I,(Disposer)&this->TokenQueue)) {
        }
        paVar1 = &local_68.Value.field_2;
        local_68.Range.Length = 0;
        local_68.Value._M_string_length = 0;
        local_68.Kind = TK_Error;
        local_68._4_4_ = 0;
        local_68.Range.Data = (char *)0x0;
        local_68.Value.field_2._8_8_ = 0;
        local_68.Value.field_2._M_allocated_capacity = 0;
        local_68.Value._M_dataplus._M_p = (pointer)paVar1;
        pNVar5 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                 ::create<llvm::yaml::Token>(&this->TokenQueue,&local_68);
        piVar6 = (this_00->Sentinel).
                 super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                 .super_node_base_type.Prev;
        (pNVar5->
        super_ilist_node<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node>
        ).
        super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
        .super_node_base_type.Next = (ilist_node_base<false> *)this_00;
        (pNVar5->
        super_ilist_node<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node>
        ).
        super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
        .super_node_base_type.Prev = piVar6;
        piVar6->Next = (ilist_node_base<false> *)pNVar5;
        (this_00->Sentinel).
        super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
        .super_node_base_type.Prev = (ilist_node_base<false> *)pNVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_68.Value._M_dataplus._M_p,
                          local_68.Value.field_2._M_allocated_capacity + 1);
        }
        piVar6 = (this->TokenQueue).List.Sentinel.
                 super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                 .super_node_base_type.Next;
LAB_00186b7d:
        return (Token *)(piVar6 + 1);
      }
      piVar6 = (this_00->Sentinel).
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
    }
    if (piVar6 == (ilist_node_base<false> *)this_00) {
      __assert_fail("!TokenQueue.empty() && \"fetchMoreTokens lied about getting tokens!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                    ,0x31e,"Token &llvm::yaml::Scanner::peekNext()");
    }
    removeStaleSimpleKeyCandidates(this);
    piVar6 = (this->TokenQueue).List.Sentinel.
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Next;
    plVar3 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                     super_SmallVectorBase.BeginX;
    uVar2 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Size;
    uVar9 = (ulong)uVar2;
    plVar8 = plVar3;
    uVar10 = uVar9;
    if (3 < uVar9) {
      uVar10 = (ulong)(uVar2 >> 2);
      lVar11 = uVar10 + 1;
      plVar8 = plVar3 + 6;
      do {
        if ((ilist_node_base<false> *)plVar8[-6] == piVar6) {
          plVar8 = plVar8 + -6;
          goto LAB_00186ae5;
        }
        if ((ilist_node_base<false> *)plVar8[-3] == piVar6) {
          plVar8 = plVar8 + -3;
          goto LAB_00186ae5;
        }
        if ((ilist_node_base<false> *)*plVar8 == piVar6) goto LAB_00186ae5;
        if ((ilist_node_base<false> *)plVar8[3] == piVar6) {
          plVar8 = plVar8 + 3;
          goto LAB_00186ae5;
        }
        lVar11 = lVar11 + -1;
        plVar8 = plVar8 + 0xc;
      } while (1 < lVar11);
      plVar8 = plVar3 + uVar10 * 0xc;
      uVar10 = ((long)(uVar9 * 0x18 + uVar10 * -0x60) >> 3) * -0x5555555555555555;
    }
    if (uVar10 == 1) {
LAB_00186a73:
      if ((ilist_node_base<false> *)*plVar8 != piVar6) goto LAB_00186b7d;
    }
    else if (uVar10 == 2) {
LAB_00186a6a:
      if ((ilist_node_base<false> *)*plVar8 != piVar6) {
        plVar8 = plVar8 + 3;
        goto LAB_00186a73;
      }
    }
    else {
      if (uVar10 != 3) goto LAB_00186b7d;
      if ((ilist_node_base<false> *)*plVar8 != piVar6) {
        plVar8 = plVar8 + 3;
        goto LAB_00186a6a;
      }
    }
LAB_00186ae5:
    bVar7 = 1;
    if (plVar8 == plVar3 + uVar9 * 3) goto LAB_00186b7d;
  } while( true );
}

Assistant:

Token &Scanner::peekNext() {
  // If the current token is a possible simple key, keep parsing until we
  // can confirm.
  bool NeedMore = false;
  while (true) {
    if (TokenQueue.empty() || NeedMore) {
      if (!fetchMoreTokens()) {
        TokenQueue.clear();
        TokenQueue.push_back(Token());
        return TokenQueue.front();
      }
    }
    assert(!TokenQueue.empty() &&
            "fetchMoreTokens lied about getting tokens!");

    removeStaleSimpleKeyCandidates();
    SimpleKey SK;
    SK.Tok = TokenQueue.begin();
    if (!is_contained(SimpleKeys, SK))
      break;
    else
      NeedMore = true;
  }
  return TokenQueue.front();
}